

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer7_memfunc.cpp
# Opt level: O2

int main(void)

{
  io_context io_context;
  Printer printer;
  io_context local_90;
  Printer local_80;
  
  boost::asio::io_context::io_context(&local_90);
  Printer::Printer(&local_80,&local_90);
  boost::asio::io_context::run(&local_90);
  Printer::~Printer(&local_80);
  boost::asio::execution_context::~execution_context(&local_90.super_execution_context);
  return 0;
}

Assistant:

int main() {
  boost::asio::io_context io_context;

  Printer printer{ io_context };

  io_context.run();

  return 0;
}